

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::ClipperOffset::Execute(ClipperOffset *this,PolyTree *solution,double delta)

{
  vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>> *this_00;
  _List_node_base *p_Var1;
  long lVar2;
  PolyNode *pPVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer pIVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  PolyNode *outerNode;
  IntRect r;
  Clipper clpr;
  PolyNode *local_188;
  IntRect local_180;
  undefined1 local_160 [136];
  ClipperBase local_d8;
  Path local_48;
  
  PolyTree::Clear(solution);
  FixOrientations(this);
  DoOffset(this,delta);
  local_d8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_CurrentLM._M_current = (LocalMinimum *)0x0;
  local_d8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160._0_8_ = &PTR_ExecuteInternal_00196c50;
  local_d8._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00196c98;
  p_Var1 = (_List_node_base *)(local_160 + 0x58);
  local_160._8_8_ = (pointer)0x0;
  local_160._16_8_ = (pointer)0x0;
  local_160._24_8_ = (pointer)0x0;
  local_160._32_8_ = (pointer)0x0;
  local_160._40_8_ = (pointer)0x0;
  local_160._48_8_ = (pointer)0x0;
  local_160._56_8_ = (pointer)0x0;
  local_160._64_8_ = (pointer)0x0;
  local_160._72_8_ = (pointer)0x0;
  local_160._104_8_ = 0;
  local_160[0x78] = false;
  local_d8.m_UseFullRange = false;
  local_160[0x84] = false;
  local_160[0x86] = false;
  local_d8.m_PreserveCollinear = false;
  local_d8.m_HasOpenPaths = false;
  local_160._88_8_ = p_Var1;
  local_160._96_8_ = p_Var1;
  ClipperBase::AddPaths(&local_d8,&this->m_destPolys,ptSubject,true);
  if (0.0 < delta) {
    Clipper::Execute((Clipper *)local_160,ctUnion,solution,pftPositive,pftPositive);
    goto LAB_0016d733;
  }
  ClipperBase::GetBounds
            (&local_180,(ClipperBase *)(*(_func_int **)(local_160._0_8_ + -0x18) + (long)local_160))
  ;
  pIVar7 = (pointer)operator_new(0x40);
  local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = pIVar7 + 4;
  pIVar7->X = local_180.left + -10;
  pIVar7->Y = local_180.bottom + 10;
  pIVar7[1].X = local_180.right + 10;
  pIVar7[1].Y = local_180.bottom + 10;
  pIVar7[2].X = local_180.right + 10;
  pIVar7[2].Y = local_180.top + -10;
  pIVar7[3].X = local_180.left + -10;
  pIVar7[3].Y = local_180.top + -10;
  local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = pIVar7;
  local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  ClipperBase::AddPath
            ((ClipperBase *)(local_160 + (long)*(_func_int **)(local_160._0_8_ + -0x18)),&local_48,
             ptSubject,true);
  local_160[0x84] = true;
  Clipper::Execute((Clipper *)local_160,ctUnion,solution,pftNegative,pftNegative);
  if ((*(long *)(solution + 0x28) - (long)*(long **)(solution + 0x20) & 0x7fffffff8U) == 8) {
    lVar2 = **(long **)(solution + 0x20);
    uVar9 = (uint)((ulong)(*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) >> 3);
    if ((int)uVar9 < 1) goto LAB_0016d709;
    this_00 = (vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>> *)
              (solution + 0x20);
    std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::reserve
              ((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)this_00,
               (ulong)(uVar9 & 0x7fffffff));
    **(undefined8 **)this_00 = **(undefined8 **)(lVar2 + 0x20);
    *(undefined8 *)(**(long **)this_00 + 0x38) = *(undefined8 *)(lVar2 + 0x38);
    lVar8 = *(long *)(lVar2 + 0x20);
    if (1 < (int)((ulong)(*(long *)(lVar2 + 0x28) - lVar8) >> 3)) {
      lVar10 = 1;
      do {
        pPVar3 = *(PolyNode **)(lVar8 + lVar10 * 8);
        lVar8 = *(long *)(solution + 0x20);
        lVar4 = *(long *)(solution + 0x28);
        local_188 = pPVar3;
        std::vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>>::
        emplace_back<ClipperLib::PolyNode*>(this_00,&local_188);
        pPVar3->Parent = (PolyNode *)solution;
        pPVar3->Index = (uint)((ulong)(lVar4 - lVar8) >> 3);
        lVar10 = lVar10 + 1;
        lVar8 = *(long *)(lVar2 + 0x20);
      } while (lVar10 < (int)((ulong)(*(long *)(lVar2 + 0x28) - lVar8) >> 3));
    }
  }
  else {
LAB_0016d709:
    PolyTree::Clear(solution);
  }
  operator_delete(pIVar7,0x40);
LAB_0016d733:
  local_160._0_8_ = &PTR_ExecuteInternal_00196c50;
  local_d8._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00196c98;
  p_Var6 = (_List_node_base *)local_160._88_8_;
  while (p_Var6 != p_Var1) {
    p_Var5 = p_Var6->_M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var5;
  }
  if ((pointer)local_160._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_160._56_8_,local_160._72_8_ - local_160._56_8_);
  }
  if ((pointer)local_160._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_160._32_8_,local_160._48_8_ - local_160._32_8_);
  }
  if ((pointer)local_160._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_160._8_8_,local_160._24_8_ - local_160._8_8_);
  }
  ClipperBase::~ClipperBase(&local_d8);
  return;
}

Assistant:

void ClipperOffset::Execute(PolyTree& solution, double delta)
{
  solution.Clear();
  FixOrientations();
  DoOffset(delta);

  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    //remove the outer PolyNode rectangle ...
    if (solution.ChildCount() == 1 && solution.Childs[0]->ChildCount() > 0)
    {
      PolyNode* outerNode = solution.Childs[0];
      solution.Childs.reserve(outerNode->ChildCount());
      solution.Childs[0] = outerNode->Childs[0];
      solution.Childs[0]->Parent = outerNode->Parent;
      for (int i = 1; i < outerNode->ChildCount(); ++i)
        solution.AddChild(*outerNode->Childs[i]);
    }
    else
      solution.Clear();
  }
}